

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

void __thiscall CLI::detail::NonNegativeNumber::~NonNegativeNumber(NonNegativeNumber *this)

{
  NonNegativeNumber *this_local;
  
  Validator::~Validator(&this->super_Validator);
  return;
}

Assistant:

NonNegativeNumber() : Validator("NONNEGATIVE") {
        func_ = [](std::string &number_str) {
            double number;
            if(!detail::lexical_cast(number_str, number)) {
                return std::string("Failed parsing number: (") + number_str + ')';
            }
            if(number < 0) {
                return std::string("Number less than 0: (") + number_str + ')';
            }
            return std::string();
        };
    }